

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O2

int tidyRunDiagnostics(TidyDoc tdoc)

{
  int iVar1;
  TidyDocImpl *impl;
  
  if (tdoc != (TidyDoc)0x0) {
    prvTidyReportMarkupVersion((TidyDocImpl *)tdoc);
    prvTidyReportNumWarnings((TidyDocImpl *)tdoc);
    if ((tdoc[0xd0b]._opaque != 0) && (tdoc[0x58]._opaque == 0)) {
      prvTidyDialogue((TidyDocImpl *)tdoc,0x21c);
    }
    iVar1 = tidyDocStatus((TidyDocImpl *)tdoc);
    return iVar1;
  }
  return -0x16;
}

Assistant:

int TIDY_CALL        tidyRunDiagnostics( TidyDoc tdoc )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    if ( impl )
      return tidyDocRunDiagnostics( impl );
    return -EINVAL;
}